

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

string * r8_to_string(string *__return_storage_ptr__,double r8,string *format)

{
  size_t sVar1;
  char local_98 [8];
  char r8_char [80];
  long local_38 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sprintf(local_98,(format->_M_dataplus)._M_p);
  r8_char._72_8_ = local_38;
  sVar1 = strlen(local_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(r8_char + 0x48),local_98,local_98 + sVar1);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(r8_char + 0x48));
  if ((long *)r8_char._72_8_ != local_38) {
    operator_delete((void *)r8_char._72_8_,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string r8_to_string ( double r8, std::string format )

//****************************************************************************80
//
//  Purpose:
//
//    R8_TO_STRING converts an R8 to a C++ string.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    09 July 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double R8, a double.
//
//    Input, string FORMAT, the format string.
//
//    Output, string R8_TO_STRING, the string.
//
{
  char r8_char[80];
  std::string r8_string;

  sprintf ( r8_char, format.c_str ( ), r8 );

  r8_string = std::string ( r8_char );

  return r8_string;
}